

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.h
# Opt level: O2

void __thiscall
MinVR::VRParseCommandLine::help
          (VRParseCommandLine *this,VRSearchConfig *configPath,string *additionalText)

{
  ostream *poVar1;
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)additionalText);
  makeHelpString(&sStack_58,this,configPath,&local_38);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&sStack_58);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void help(VRSearchConfig &configPath, const std::string additionalText = "") {
    std::cerr << makeHelpString(configPath, additionalText) << std::endl;
  }